

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall myGame::Game::Game(Game *this,int height,int weight)

{
  char **ppcVar1;
  int local_6c;
  int local_68;
  int j;
  int i_1;
  int i;
  Snake local_58;
  int local_18;
  int local_14;
  int weight_local;
  int height_local;
  Game *this_local;
  
  local_18 = weight;
  local_14 = height;
  _weight_local = this;
  Snake::Snake(&this->snake);
  Point::Point(&this->lr_window);
  this->W = local_18;
  this->H = local_14;
  Point::Point((Point *)&i_1,0,0);
  Snake::Snake(&local_58,(Point *)&i_1,&Point::dir_left);
  Snake::operator=(&this->snake,&local_58);
  Snake::~Snake(&local_58);
  ppcVar1 = getMap(this->W,this->H);
  this->map = ppcVar1;
  for (j = 0; j < 3000; j = j + 1) {
    getFood(this);
  }
  this->points = 0;
  for (local_68 = 0; local_68 < this->H; local_68 = local_68 + 1) {
    for (local_6c = 0; local_6c < this->W; local_6c = local_6c + 1) {
      this->map[local_68][local_6c] = '.';
    }
  }
  return;
}

Assistant:

Game::Game(int height, int weight){
	W = weight;
	H = height;
	snake = Snake(Point(0, 0), Point::dir_left);
	map = getMap(W, H);
	for (int i = 0; i < 3000; i++){
		getFood();
	}
	points = 0;
	for (int i = 0; i < H; i++){
		for (int j = 0; j < W; j++){
			map[i][j] = CHR_NOTHING;
			// map2[i][j] = map[i][j];
		}
	}
}